

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O1

void train<dynet::AttentionalModel<dynet::SimpleRNNBuilder>>
               (Model *model,AttentionalModel<dynet::SimpleRNNBuilder> *am,Corpus *training,
               Corpus *devel,Trainer *sgd,string *out_file,bool curriculum,int max_epochs,bool doco,
               float coverage,bool display,bool fert)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this;
  uint uVar1;
  iterator __position;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  pointer ptVar6;
  _Rb_tree_node_base *p_Var7;
  Expression *pEVar8;
  ostream *poVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  Tensor *pTVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  VariableIndex VVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  float fVar20;
  double dVar21;
  undefined1 in_ZMM2 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  Sentence tsent;
  Sentence ssent;
  Expression objective;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  order_by_length;
  Expression fertility_nll;
  Expression coverage_penalty;
  Expression xent;
  Expression iloss;
  Expression alignment;
  multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  lengths;
  double local_488;
  double local_468;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_458;
  Trainer *local_440;
  int local_434;
  int local_430;
  uint local_42c;
  vector<int,_std::allocator<int>_> local_428;
  vector<int,_std::allocator<int>_> local_408;
  Expression local_3f0;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  float local_3c4;
  float local_3c0;
  undefined4 local_3bc;
  uint local_3b8;
  uint local_3b4;
  double local_3b0;
  Expression local_3a8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_398;
  undefined8 local_380;
  undefined4 local_378;
  Expression local_370;
  undefined8 local_360;
  ComputationGraph *local_358;
  Model *local_350;
  string *local_348;
  undefined8 *local_340;
  Expression *local_338;
  ComputationGraph *local_330;
  uint local_328;
  undefined1 local_320 [40];
  undefined1 local_2f8 [8];
  VariableIndex local_2f0;
  basic_text_oprimitive<std::ostream> local_2c8 [88];
  vector<int,_std::allocator<int>_> local_270;
  vector<int,_std::allocator<int>_> local_258;
  Expression local_240;
  undefined1 local_230 [8];
  undefined1 local_228 [8];
  _Base_ptr local_220;
  _Rb_tree_node_base *local_218;
  _Rb_tree_node_base *local_210;
  ulong local_208;
  ios_base local_138 [264];
  
  uVar18 = ((long)(training->
                  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(training->
                  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_440 = sgd;
  local_350 = model;
  local_348 = out_file;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_458,uVar18,(allocator_type *)local_230);
  if ((long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar12 = 0;
    do {
      local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12] = (uint)uVar12;
      uVar12 = uVar12 + 1;
    } while ((uVar12 & 0xffffffff) <
             (ulong)((long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2));
  }
  local_398.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (curriculum) {
    local_228._0_4_ = _S_red;
    local_220 = (_Base_ptr)0x0;
    local_208 = 0;
    ptVar6 = (training->
             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_218 = (_Rb_tree_node_base *)local_228;
    local_210 = (_Rb_tree_node_base *)local_228;
    if ((training->
        super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != ptVar6) {
      uVar16 = 1;
      uVar12 = 0;
      do {
        local_2f0.t = uVar16 - 1;
        local_2f8 = (undefined1  [8])
                    ((long)ptVar6[uVar12].
                           super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                           .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                           _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)ptVar6[uVar12].
                           super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                           .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                           _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_const,unsigned_int>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>>
        ::_M_emplace_equal<std::pair<unsigned_long,unsigned_int>>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_const,unsigned_int>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>>
                    *)local_230,(pair<unsigned_long,_unsigned_int> *)local_2f8);
        uVar12 = (ulong)uVar16;
        ptVar6 = (training->
                 super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar13 = ((long)(training->
                        super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar6 >> 3) *
                 0x6db6db6db6db6db7;
        uVar16 = uVar16 + 1;
      } while (uVar12 <= uVar13 && uVar13 - uVar12 != 0);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(&local_398,10);
    if (local_218 != (_Rb_tree_node_base *)local_228) {
      uVar12 = 0;
      iVar14 = 0;
      p_Var7 = local_218;
      do {
        if ((uint)((uint)(iVar14 * 10) / local_208) < 10) {
          uVar13 = uVar12 / local_208;
          do {
            this = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   (local_398.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar13);
            __position._M_current = *(uint **)(this + 8);
            if (__position._M_current == *(uint **)(this + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(this,__position,(uint *)&p_Var7[1]._M_parent);
            }
            else {
              *__position._M_current = *(uint *)&p_Var7[1]._M_parent;
              *(uint **)(this + 8) = __position._M_current + 1;
            }
            bVar19 = uVar13 < 9;
            uVar13 = uVar13 + 1;
          } while (bVar19);
        }
        iVar14 = iVar14 + 1;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        uVar12 = (ulong)((int)uVar12 + 10);
      } while (p_Var7 != (_Rb_tree_node_base *)local_228);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                 *)local_230);
  }
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (display) {
    ptVar6 = (devel->
             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((devel->
        super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != ptVar6) {
      uVar18 = 0;
      do {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_408,
                   &ptVar6[uVar18].
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_428,
                   &ptVar6[uVar18].
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                    super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl);
        dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_230);
        local_2f8 = (undefined1  [8])0x0;
        local_2f0.t = 0;
        if (doco) {
          pEVar8 = (Expression *)context(devel,(uint)uVar18);
        }
        else {
          pEVar8 = (Expression *)0x0;
        }
        dynet::AttentionalModel<dynet::SimpleRNNBuilder>::BuildGraph
                  ((AttentionalModel<dynet::SimpleRNNBuilder> *)local_320,
                   (vector<int,_std::allocator<int>_> *)am,&local_408,(ComputationGraph *)&local_428
                   ,(Expression *)local_230,(vector<int,_std::allocator<int>_> *)local_2f8,pEVar8,
                   (Expression *)0x0);
        dynet::ComputationGraph::forward((Expression *)local_230);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n====== SENTENCE ",0x11);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," =========\n",0xb);
        dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_ascii
                  (am,&local_408,&local_428,(ComputationGraph *)local_230,(Expression *)local_2f8,
                   &sd,&td);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_tikz
                  (am,&local_408,&local_428,(ComputationGraph *)local_230,(Expression *)local_2f8,
                   &sd,&td);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_230);
        uVar18 = (ulong)((uint)uVar18 + 1);
        ptVar6 = (devel->
                 super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(devel->
                        super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar6 >> 3) *
                 0x6db6db6db6db6db7;
      } while (uVar18 <= uVar12 && uVar12 - uVar18 != 0);
    }
  }
  else {
    local_3c4 = (float)max_epochs;
    if (*(float *)(local_440 + 0x14) < local_3c4) {
      local_338 = (Expression *)0x0;
      if (0.0 < coverage) {
        local_338 = &local_370;
      }
      local_340 = (undefined8 *)0x0;
      if (fert) {
        local_340 = &local_380;
      }
      local_358 = _VTT;
      local_360 = _rand01;
      bVar19 = true;
      local_3b0 = 9e+99;
      local_42c = 0;
      local_434 = 0;
      local_430 = 0;
      do {
        local_230 = (undefined1  [8])&local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"completed in","");
        local_320._0_8_ = local_320 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_320,local_230,
                   (ComputationGraph *)((long)local_230 + CONCAT44(local_228._4_4_,local_228._0_4_))
                  );
        local_320._32_8_ = std::chrono::_V2::system_clock::now();
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230);
        }
        local_434 = local_434 + 0x32;
        local_3e0 = 0.0;
        lVar17 = 0;
        iVar5 = 0;
        iVar14 = 0;
        local_3d8 = 0.0;
        local_3d0 = 0.0;
        do {
          uVar16 = (uint)uVar18;
          if (((long)(training->
                     super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(training->
                     super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 -
              (uVar18 & 0xffffffff) == 0) {
            uVar16 = 0;
            bVar4 = false;
            if (!bVar19) {
              in_ZMM2 = ZEXT464(0x3f800000);
              fVar20 = *(float *)(local_440 + 0x14);
              *(float *)(local_440 + 0x14) = fVar20 + 1.0;
              auVar3 = vfmadd132ss_fma(ZEXT416((uint)(fVar20 + 1.0)),in_ZMM2._0_16_,
                                       ZEXT416(*(uint *)(local_440 + 0x10)));
              *(float *)(local_440 + 0xc) = *(float *)(local_440 + 8) / auVar3._0_4_;
              bVar4 = bVar19;
            }
            bVar19 = bVar4;
            if ((curriculum) &&
               (uVar18 = (ulong)local_42c,
               uVar12 = ((long)local_398.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_398.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
               , uVar18 <= uVar12 && uVar12 - uVar18 != 0)) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&local_458,
                         local_398.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Curriculum learning, with ",0x1a);
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," examples\n",10);
              local_42c = local_42c + 1;
            }
          }
          uVar18 = (ulong)uVar16;
          if (uVar18 % (ulong)((long)local_458.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_458.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"**SHUFFLE\n",10);
            std::
            shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,dynet::rndeng);
          }
          if ((lVar17 == 0x31) && (verbose != false)) {
            uVar1 = local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [uVar18 % (ulong)((long)local_458.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_458.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 2)];
            ptVar6 = (training->
                     super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::vector<int,_std::allocator<int>_>::operator=
                      (&local_408,
                       &ptVar6[uVar1].
                        super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                        .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                        _M_head_impl);
            std::vector<int,_std::allocator<int>_>::operator=
                      (&local_428,
                       &ptVar6[uVar1].
                        super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                        .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                        super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                        _M_head_impl);
            dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_230);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"\nDecoding source, greedy Viterbi: ",0x22);
            if (doco) {
              pvVar10 = context(training,local_458.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [uVar18 % (ulong)((long)local_458.
                                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_458.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2)]);
            }
            else {
              pvVar10 = (vector<int,_std::allocator<int>_> *)0x0;
            }
            dynet::AttentionalModel<dynet::SimpleRNNBuilder>::greedy_decode
                      (&local_258,am,&local_408,(ComputationGraph *)local_230,&td,pvVar10);
            if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"\nDecoding source, sampling: ",0x1c);
            if (doco) {
              pvVar10 = context(training,local_458.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [uVar18 % (ulong)((long)local_458.
                                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_458.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2)]);
            }
            else {
              pvVar10 = (vector<int,_std::allocator<int>_> *)0x0;
            }
            dynet::AttentionalModel<dynet::SimpleRNNBuilder>::sample
                      (&local_270,am,&local_408,(ComputationGraph *)local_230,&td,pvVar10);
            if ((pointer)local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_230);
          }
          uVar1 = local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [uVar18 % (ulong)((long)local_458.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_458.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2)];
          ptVar6 = (training->
                   super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::vector<int,_std::allocator<int>_>::operator=
                    (&local_408,
                     &ptVar6[uVar1].
                      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                      .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                      _M_head_impl);
          std::vector<int,_std::allocator<int>_>::operator=
                    (&local_428,
                     &ptVar6[uVar1].
                      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                      .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                      super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                      _M_head_impl);
          dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_230);
          uVar13 = (long)local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          uVar12 = (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          uVar18 = (ulong)(uVar16 + 1);
          local_2f8 = (undefined1  [8])0x0;
          local_2f0.t = 0;
          local_370.pg = (ComputationGraph *)0x0;
          local_370.i.t = 0;
          local_380 = 0;
          local_378 = 0;
          pEVar8 = (Expression *)0x0;
          if (doco) {
            pEVar8 = (Expression *)
                     context(training,local_458.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [uVar18 % (ulong)((long)local_458.
                                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_458.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2)]);
          }
          dynet::AttentionalModel<dynet::SimpleRNNBuilder>::BuildGraph
                    ((AttentionalModel<dynet::SimpleRNNBuilder> *)&local_330,
                     (vector<int,_std::allocator<int>_> *)am,&local_408,
                     (ComputationGraph *)&local_428,(Expression *)local_230,
                     (vector<int,_std::allocator<int>_> *)local_2f8,pEVar8,local_338);
          local_3f0.pg = local_330;
          local_3f0.i.t = local_328;
          if (0.0 < coverage) {
            dynet::expr::operator*(&local_240,coverage);
            dynet::expr::operator+(&local_3a8,&local_3f0);
            local_3f0.pg = local_3a8.pg;
            local_3f0.i.t = local_3a8.i.t;
          }
          if (fert) {
            dynet::expr::operator+(&local_3a8,&local_3f0);
            local_3f0.pg = local_3a8.pg;
            local_3f0.i.t = local_3a8.i.t;
          }
          dynet::ComputationGraph::forward((Expression *)local_230);
          local_3b4 = local_328;
          VVar15.t = (uint)(Expression *)local_230;
          pTVar11 = (Tensor *)dynet::ComputationGraph::get_value(VVar15);
          local_3c0 = (float)dynet::as_scalar(pTVar11);
          if (0.0 < coverage) {
            local_3b8 = local_370.i.t;
            pTVar11 = (Tensor *)dynet::ComputationGraph::get_value(VVar15);
            fVar20 = (float)dynet::as_scalar(pTVar11);
            local_3d8 = local_3d8 + (double)fVar20;
          }
          if (fert) {
            local_3bc = local_378;
            pTVar11 = (Tensor *)dynet::ComputationGraph::get_value(VVar15);
            fVar20 = (float)dynet::as_scalar(pTVar11);
            local_3e0 = local_3e0 + (double)fVar20;
          }
          dynet::ComputationGraph::backward((Expression *)local_230);
          dynet::Trainer::update(1.0);
          if (verbose == true) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"chug ",5);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\r",1);
            std::ostream::flush();
            if (lVar17 == 0x31) {
              dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_ascii
                        (am,&local_408,&local_428,(ComputationGraph *)local_230,
                         (Expression *)local_2f8,&sd,&td);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_tikz
                        (am,&local_408,&local_428,(ComputationGraph *)local_230,
                         (Expression *)local_2f8,&sd,&td);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            }
          }
          iVar14 = iVar14 + -1 + (int)(uVar13 >> 2);
          iVar5 = iVar5 + -1 + (int)(uVar12 >> 2);
          local_3d0 = local_3d0 + (double)local_3c0;
          dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_230);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x32);
        dynet::Trainer::status(local_440);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," E = ",5);
        auVar3 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,iVar5);
        dVar21 = local_3d0 / auVar3._0_8_;
        poVar9 = std::ostream::_M_insert<double>(dVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ppl=",5);
        dVar21 = exp(dVar21);
        poVar9 = std::ostream::_M_insert<double>(dVar21);
        local_230[0] = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_230,1);
        if (0.0 < coverage) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"cover=",6);
          auVar3 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,iVar14);
          poVar9 = std::ostream::_M_insert<double>(local_3d8 / auVar3._0_8_);
          local_230[0] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_230,1);
        }
        if (fert) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"fert_ppl=",9);
          auVar3 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,iVar14);
          dVar21 = exp(local_3e0 / auVar3._0_8_);
          poVar9 = std::ostream::_M_insert<double>(dVar21);
          local_230[0] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_230,1);
        }
        local_430 = local_430 + 1;
        if (((uint)(local_430 * 0x26e978d5) >> 2 | local_430 * 0x40000000) < 0x83126f) {
          ptVar6 = (devel->
                   super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((devel->
              super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_finish == ptVar6) {
            local_488 = 0.0;
            local_468 = 0.0;
          }
          else {
            local_488 = 0.0;
            uVar12 = 0;
            iVar14 = 0;
            do {
              std::vector<int,_std::allocator<int>_>::operator=
                        (&local_408,
                         &ptVar6[uVar12].
                          super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                          .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                          _M_head_impl);
              std::vector<int,_std::allocator<int>_>::operator=
                        (&local_428,
                         &ptVar6[uVar12].
                          super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                          .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                          super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                          _M_head_impl);
              dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_230);
              if (doco) {
                pEVar8 = (Expression *)context(devel,(uint)uVar12);
              }
              else {
                pEVar8 = (Expression *)0x0;
              }
              dynet::AttentionalModel<dynet::SimpleRNNBuilder>::BuildGraph
                        ((AttentionalModel<dynet::SimpleRNNBuilder> *)local_2f8,
                         (vector<int,_std::allocator<int>_> *)am,&local_408,
                         (ComputationGraph *)&local_428,(Expression *)local_230,
                         (vector<int,_std::allocator<int>_> *)0x0,pEVar8,(Expression *)0x0);
              pTVar11 = (Tensor *)dynet::ComputationGraph::forward((Expression *)local_230);
              fVar20 = (float)dynet::as_scalar(pTVar11);
              local_488 = local_488 + (double)fVar20;
              iVar14 = iVar14 + -1 +
                       (int)((ulong)((long)local_428.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2);
              dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_230);
              uVar12 = (ulong)((uint)uVar12 + 1);
              ptVar6 = (devel->
                       super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar13 = ((long)(devel->
                              super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar6 >> 3) *
                       0x6db6db6db6db6db7;
            } while (uVar12 <= uVar13 && uVar13 - uVar12 != 0);
            local_468 = (double)iVar14;
          }
          if (local_488 < local_3b0) {
            std::ofstream::ofstream((Expression *)local_230,(string *)local_348,_S_out);
            boost::archive::text_oarchive::text_oarchive
                      ((text_oarchive *)local_2f8,(ostream *)local_230,0);
            boost::serialization::
            singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_dynet::Model>_>
            ::get_instance();
            boost::archive::detail::basic_oarchive::save_object
                      ((basic_oarchive *)local_2f8,(basic_oserializer *)local_350);
            boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)local_2f8);
            boost::archive::basic_text_oprimitive<std::ostream>::~basic_text_oprimitive(local_2c8);
            local_230 = (undefined1  [8])local_358;
            *(undefined8 *)(local_230 + *(long *)(local_358 + -0x18)) = local_360;
            std::filebuf::~filebuf((filebuf *)local_228);
            std::ios_base::~ios_base(local_138);
            local_3b0 = local_488;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\n***DEV [epoch=",0xf);
          auVar3 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,local_434);
          auVar2 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                      ((long)(training->
                                             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(training->
                                             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start >> 3) *
                                      0x6db6db6db6db6db7);
          poVar9 = std::ostream::_M_insert<double>(auVar3._0_8_ / auVar2._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] E = ",6);
          poVar9 = std::ostream::_M_insert<double>(local_488 / local_468);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ppl=",5);
          dVar21 = exp(local_488 / local_468);
          poVar9 = std::ostream::_M_insert<double>(dVar21);
          local_230[0] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_230,1);
        }
        dynet::Timer::~Timer((Timer *)local_320);
      } while (*(float *)(local_440 + 0x14) < local_3c4);
    }
  }
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_398);
  if (local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void train(Model &model, AM_t &am, Corpus &training, Corpus &devel, 
	Trainer &sgd, string out_file, bool curriculum, int max_epochs, 
        bool doco, float coverage, bool display, bool fert)
{
    double best = 9e+99;
    unsigned report_every_i = 50;
    unsigned dev_every_i_reports = 500; 
    unsigned si = training.size();
    vector<unsigned> order(training.size());
    for (unsigned i = 0; i < order.size(); ++i) order[i] = i;

    vector<vector<unsigned>> order_by_length; 
    const unsigned curriculum_steps = 10;
    if (curriculum) {
	// simple form of curriculum learning: for the first K epochs, use only
	// the shortest examples from the training set. E.g., K=10, then in
	// epoch 0 using the first decile, epoch 1 use the first & second
	// deciles etc. up to the full dataset in k >= 9.
	multimap<size_t, unsigned> lengths;
	for (unsigned i = 0; i < training.size(); ++i) 
	    lengths.insert(make_pair(get<0>(training[i]).size(), i));

	order_by_length.resize(curriculum_steps);
	unsigned i = 0;
	for (auto& landi: lengths) {
	    for (unsigned k = i * curriculum_steps / lengths.size(); k < curriculum_steps; ++k)  
		order_by_length[k].push_back(landi.second);
	    ++i;
	}
    }

    bool first = true;
    unsigned report = 0;
    unsigned lines = 0;
    unsigned epoch = 0;
    Sentence ssent, tsent;
    int docid;

    // FIXME: move this into sep function
    if (display) {
        // display the alignments
        //
        for (unsigned i = 0; i < devel.size(); ++i) {
            tie(ssent, tsent, docid) = devel[i];
            ComputationGraph cg;
            Expression alignment;
            auto iloss = am.BuildGraph(ssent, tsent, cg, &alignment, (doco) ? context(devel, i) : nullptr);
            cg.forward(iloss);

            cout << "\n====== SENTENCE " << i << " =========\n";
            am.display_ascii(ssent, tsent, cg, alignment, sd, td);
            cout << "\n";

            am.display_tikz(ssent, tsent, cg, alignment, sd, td);
            cout << "\n";
        }

        return;
    }

#if 0
        if (true) {
            double dloss = 0;
            int dchars = 0;
            for (unsigned i = 0; i < devel.size(); ++i) {
                tie(ssent, tsent, docid) = devel[i];
                ComputationGraph cg;
                am.BuildGraph(ssent, tsent, cg, nullptr, (doco) ? context(devel, i) : nullptr);
                dloss += as_scalar(cg.forward());
                dchars += tsent.size() - 1;
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(out_file);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "] E = " << (dloss / dchars) << " ppl=" << exp(dloss / dchars) << ' ';
        }
#endif

    while (sgd.epoch < max_epochs) {
        Timer iteration("completed in");
        double loss = 0;
        double penalty = 0;
        double loss_fert = 0;
        unsigned words_src = 0;
        unsigned words_tgt = 0;

        for (unsigned iter = 0; iter < report_every_i; ++iter) {

            if (si == training.size()) {
                si = 0;
                if (first) { first = false; } else { sgd.update_epoch(); }

		if (curriculum && epoch < order_by_length.size()) {
		    order = order_by_length[epoch++];
		    cerr << "Curriculum learning, with " << order.size() << " examples\n";
		} 
	    }

            if (si % order.size() == 0) {
                cerr << "**SHUFFLE\n";
                shuffle(order.begin(), order.end(), *rndeng);
	    }

	    if (verbose && iter+1 == report_every_i) {
		tie(ssent, tsent, docid) = training[order[si % order.size()]];
		ComputationGraph cg;
                cerr << "\nDecoding source, greedy Viterbi: ";
                am.greedy_decode(ssent, cg, td, (doco) ? context(training, order[si % order.size()]) : nullptr);

                cerr << "\nDecoding source, sampling: ";
                am.sample(ssent, cg, td, (doco) ? context(training, order[si % order.size()]) : nullptr);
	    }

            // build graph for this instance
	    tie(ssent, tsent, docid) = training[order[si % order.size()]];
	    ComputationGraph cg;
            words_src += ssent.size() - 1;
            words_tgt += tsent.size() - 1;
            ++si;
            Expression alignment, coverage_penalty, fertility_nll;
            Expression xent = am.BuildGraph(ssent, tsent, cg, &alignment, 
                    (doco) ? context(training, order[si % order.size()]) : nullptr, 
                    (coverage > 0) ? &coverage_penalty : nullptr,
                    (fert) ? &fertility_nll : nullptr);

            Expression objective = xent;
            if (coverage > 0) 
                objective = objective + coverage * coverage_penalty;
            if (fert) 
                objective = objective + fertility_nll;

            // perform forward computation for aggregate objective
            cg.forward(objective);

            // grab the parts of the objective
            loss += as_scalar(cg.get_value(xent.i));
            if (coverage > 0) 
                penalty += as_scalar(cg.get_value(coverage_penalty.i));
            if (fert) 
                loss_fert += as_scalar(cg.get_value(fertility_nll.i));

            cg.backward(objective);
	    sgd.update();
            ++lines;

	    if (verbose) {
		cerr << "chug " << iter << "\r" << flush;
		if (iter+1 == report_every_i) {
		    // display the alignment
		    am.display_ascii(ssent, tsent, cg, alignment, sd, td);
                    cout << "\n";
		    am.display_tikz(ssent, tsent, cg, alignment, sd, td);
                    cout << "\n";
		}
	    }
        }
        sgd.status();

        //loss -= coverage * penalty - loss_fert;
        cerr << " E = " << (loss / words_tgt) << " ppl=" << exp(loss / words_tgt) << ' ';
        if (coverage > 0) 
            cerr << "cover=" << penalty/words_src << ' ';
        if (fert)
            cerr << "fert_ppl=" << exp(loss_fert / words_src) << ' ';

        // show score on dev data?
        report++;
        if (report % dev_every_i_reports == 0) {
            double dloss = 0;
            int dchars = 0;
            for (unsigned i = 0; i < devel.size(); ++i) {
                tie(ssent, tsent, docid) = devel[i];
                ComputationGraph cg;
                auto idloss = am.BuildGraph(ssent, tsent, cg, nullptr, (doco) ? context(devel, i) : nullptr, nullptr, nullptr);
                dloss += as_scalar(cg.forward(idloss));
                dchars += tsent.size() - 1;
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(out_file, ofstream::out);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            //else{
            //	sgd.eta *= 0.5;
            //}
            cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "] E = " << (dloss / dchars) << " ppl=" << exp(dloss / dchars) << ' ';
        }
    }
}